

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O3

int __thiscall pbrt::Instance::writeTo(Instance *this,BinaryWriter *binary)

{
  SP local_28;
  int32_t local_14;
  
  BinaryWriter::writeRaw(binary,&this->xfm,0x30);
  local_28.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &((this->object).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_Entity;
  local_28.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->object).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (local_28.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_28.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_28.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_28.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_14 = BinaryWriter::serialize(binary,&local_28);
  BinaryWriter::writeRaw(binary,&local_14,4);
  if (local_28.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<pbrt::Entity,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return 4;
}

Assistant:

int Instance::writeTo(BinaryWriter &binary) 
  {
    binary.write(xfm);
    binary.write(binary.serialize(object));
    return TYPE_INSTANCE;
  }